

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RangeDynamicLayerParams::SerializeWithCachedSizes
          (RangeDynamicLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  RangeDynamicLayerParams *this_local;
  
  fVar1 = startvalue(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = startvalue(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,fVar1,output);
  }
  fVar1 = stepsizevalue(this);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = stepsizevalue(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar1,output);
  }
  return;
}

Assistant:

void RangeDynamicLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.RangeDynamicLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float startValue = 2;
  if (this->startvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->startvalue(), output);
  }

  // float stepSizeValue = 3;
  if (this->stepsizevalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->stepsizevalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.RangeDynamicLayerParams)
}